

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O2

bool __thiscall
duckdb_snappy::SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator>::SlowAppend
          (SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator> *this,char *ip,size_t len)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  ulong __n;
  
  __n = (long)this->op_limit_ - (long)this->op_ptr_;
  while( true ) {
    uVar2 = len - __n;
    if (len < __n || uVar2 == 0) break;
    switchD_016b0717::default(this->op_ptr_,ip,__n);
    pcVar1 = this->op_ptr_;
    this->op_ptr_ = pcVar1 + __n;
    pcVar1 = pcVar1 + __n + (this->full_size_ - (long)this->op_base_);
    this->full_size_ = (size_t)pcVar1;
    if ((char *)this->expected_ < pcVar1 + uVar2) goto LAB_01f27ba8;
    ip = ip + __n;
    uVar3 = (long)this->expected_ - (long)pcVar1;
    __n = 0x10000;
    if (uVar3 < 0x10000) {
      __n = uVar3;
    }
    pcVar1 = SnappySinkAllocator::Allocate(&this->allocator_,(int)__n);
    this->op_base_ = pcVar1;
    this->op_ptr_ = pcVar1;
    this->op_limit_ = pcVar1 + __n;
    if (0x3e < uVar3) {
      uVar3 = 0x3f;
    }
    this->op_limit_min_slop_ = pcVar1 + __n + -uVar3;
    std::vector<char_*,_std::allocator<char_*>_>::push_back(&this->blocks_,&this->op_base_);
    len = uVar2;
  }
  switchD_016b0717::default(this->op_ptr_,ip,len);
  this->op_ptr_ = this->op_ptr_ + len;
LAB_01f27ba8:
  return len <= __n;
}

Assistant:

bool SnappyScatteredWriter<Allocator>::SlowAppend(const char* ip, size_t len) {
  size_t avail = op_limit_ - op_ptr_;
  while (len > avail) {
    // Completely fill this block
    std::memcpy(op_ptr_, ip, avail);
    op_ptr_ += avail;
    assert(op_limit_ - op_ptr_ == 0);
    full_size_ += (op_ptr_ - op_base_);
    len -= avail;
    ip += avail;

    // Bounds check
    if (full_size_ + len > expected_) return false;

    // Make new block
    size_t bsize = std::min<size_t>(kBlockSize, expected_ - full_size_);
    op_base_ = allocator_.Allocate(bsize);
    op_ptr_ = op_base_;
    op_limit_ = op_base_ + bsize;
    op_limit_min_slop_ = op_limit_ - std::min<size_t>(kSlopBytes - 1, bsize);

    blocks_.push_back(op_base_);
    avail = bsize;
  }

  std::memcpy(op_ptr_, ip, len);
  op_ptr_ += len;
  return true;
}